

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O3

string * duckdb::ExtensionHelper::AddExtensionInstallHintToErrorMsg
                   (string *__return_storage_ptr__,DatabaseInstance *db,string *base_error,
                   string *extension_name)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string install_hint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  bVar4 = CanAutoloadExtension(extension_name);
  if (bVar4) {
    if ((db->config).options.autoload_known_extensions == false) {
      ::std::operator+(&local_50,"Please try installing and loading the ",extension_name);
      puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_50);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = puVar6[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*puVar6;
      }
      local_70 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_78,(ulong)(extension_name->_M_dataplus)._M_p);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118.field_2._8_8_ = puVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_118._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
      local_f8 = &local_e8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_e8 = *plVar5;
        lStack_e0 = puVar6[3];
      }
      else {
        local_e8 = *plVar5;
        local_f8 = (long *)*puVar6;
      }
      local_f0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_f8,(ulong)(extension_name->_M_dataplus)._M_p);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = puVar6[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar5;
        local_b8 = (long *)*puVar6;
      }
      local_b0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b8);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_c8 = *plVar5;
        lStack_c0 = puVar6[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar5;
        local_d8 = (long *)*puVar6;
      }
      local_d0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      pbVar3 = &local_50;
    }
    else {
      if ((db->config).options.autoinstall_known_extensions != false) goto LAB_00483593;
      ::std::operator+(&local_118,"Please try installing the ",extension_name);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_118);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_e8 = *plVar7;
        lStack_e0 = plVar5[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar7;
        local_f8 = (long *)*plVar5;
      }
      local_f0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_f8,(ulong)(extension_name->_M_dataplus)._M_p);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = puVar6[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar5;
        local_b8 = (long *)*puVar6;
      }
      local_b0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b8);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_c8 = *plVar5;
        lStack_c0 = puVar6[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar5;
        local_d8 = (long *)*puVar6;
      }
      local_d0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      pbVar3 = &local_118;
    }
    local_50._M_dataplus._M_p = *(pointer *)((pbVar3->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &pbVar3->field_2) goto LAB_00483593;
  }
  else {
    ::std::operator+(&local_50,"Please try installing and loading the ",extension_name);
    local_58 = base_error;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar5[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)(extension_name->_M_dataplus)._M_p);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118.field_2._8_8_ = plVar5[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar8;
      local_118._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_e8 = *plVar5;
      lStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar5;
      local_f8 = (long *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)(extension_name->_M_dataplus)._M_p);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_a8 = *plVar7;
      lStack_a0 = plVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar7;
      local_b8 = (long *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_b8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_c8 = *plVar7;
      lStack_c0 = plVar5[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar7;
      local_d8 = (long *)*plVar5;
    }
    local_d0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    base_error = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00483593;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_00483593:
  if (local_90 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (base_error->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + base_error->_M_string_length);
  }
  else {
    pcVar1 = (base_error->_M_dataplus)._M_p;
    local_d8 = &local_c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + base_error->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_d8);
    plVar5 = (long *)::std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExtensionHelper::AddExtensionInstallHintToErrorMsg(DatabaseInstance &db, const string &base_error,
                                                          const string &extension_name) {
	string install_hint;

	auto &config = db.config;

	if (!ExtensionHelper::CanAutoloadExtension(extension_name)) {
		install_hint = "Please try installing and loading the " + extension_name + " extension:\nINSTALL " +
		               extension_name + ";\nLOAD " + extension_name + ";\n\n";
	} else if (!config.options.autoload_known_extensions) {
		install_hint =
		    "Please try installing and loading the " + extension_name + " extension by running:\nINSTALL " +
		    extension_name + ";\nLOAD " + extension_name +
		    ";\n\nAlternatively, consider enabling auto-install "
		    "and auto-load by running:\nSET autoinstall_known_extensions=1;\nSET autoload_known_extensions=1;";
	} else if (!config.options.autoinstall_known_extensions) {
		install_hint =
		    "Please try installing the " + extension_name + " extension by running:\nINSTALL " + extension_name +
		    ";\n\nAlternatively, consider enabling autoinstall by running:\nSET autoinstall_known_extensions=1;";
	}

	if (!install_hint.empty()) {
		return base_error + "\n\n" + install_hint;
	}

	return base_error;
}